

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

iterator __thiscall
fmt::v5::
format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
::on_format_specs(format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                  *this,iterator it)

{
  size_t *psVar1;
  basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>
  *pbVar2;
  char *pcVar3;
  long lVar4;
  type tVar6;
  null_terminating_iterator<char> it_00;
  null_terminating_iterator<char> nVar7;
  iterator iVar8;
  specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>
  handler;
  arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_> local_88;
  format_specs local_68;
  format_specs *local_48;
  basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>
  *local_40;
  type local_38;
  char *pcVar5;
  
  pcVar5 = (this->context).
           super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
           .parse_context_.format_str_.data_;
  lVar4 = (long)it.ptr_ - (long)pcVar5;
  if (-1 < lVar4) {
    (this->context).
    super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
    .parse_context_.format_str_.data_ = pcVar5 + lVar4;
    psVar1 = &(this->context).
              super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
              .parse_context_.format_str_.size_;
    *psVar1 = *psVar1 - lVar4;
    pbVar2 = &this->context;
    local_38 = (this->arg).type_;
    if (local_38 == custom_type) {
      (*(this->arg).value_.field_0.custom.format)((this->arg).value_.field_0.pointer,pbVar2);
      pcVar5 = (this->context).
               super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
               .parse_context_.format_str_.data_;
      nVar7.end_ = pcVar5 + (this->context).
                            super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
                            .parse_context_.format_str_.size_;
      nVar7.ptr_ = pcVar5;
    }
    else {
      if (local_38 == named_arg_type) {
        __assert_fail("(false) && \"invalid argument type\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/fireice-uk[P]gulps/fmt/format.h"
                      ,0x4d2,
                      "typename internal::result_of<Visitor (int)>::type fmt::visit(Visitor &&, basic_format_arg<Context>) [Visitor = fmt::internal::custom_formatter<char, fmt::basic_format_context<std::back_insert_iterator<fmt::internal::basic_buffer<char>>, char>>, Context = fmt::basic_format_context<std::back_insert_iterator<fmt::internal::basic_buffer<char>>, char>]"
                     );
      }
      local_68.super_align_spec.width_ = 0;
      local_68.super_align_spec.fill_ = L' ';
      local_68.super_align_spec.align_ = ALIGN_DEFAULT;
      local_68.flags_ = 0;
      local_68.precision_ = -1;
      local_68.type_ = '\0';
      it_00.end_ = (char *)&local_48;
      it_00.ptr_ = it.end_;
      local_48 = &local_68;
      local_40 = pbVar2;
      nVar7 = internal::
              parse_format_specs<fmt::v5::internal::null_terminating_iterator<char>,fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>>&>
                        ((internal *)it.ptr_,it_00,
                         (specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>
                          *)(ulong)local_38);
      pcVar5 = nVar7.ptr_;
      if ((pcVar5 == nVar7.end_) || (*pcVar5 != '}')) {
        internal::error_handler::on_error((error_handler *)this,"missing \'}\' in format string");
      }
      pcVar3 = (pbVar2->
               super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
               ).parse_context_.format_str_.data_;
      lVar4 = (long)pcVar5 - (long)pcVar3;
      if (lVar4 < 0) goto LAB_0011f024;
      (this->context).
      super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
      .parse_context_.format_str_.data_ = pcVar3 + lVar4;
      psVar1 = &(this->context).
                super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
                .parse_context_.format_str_.size_;
      *psVar1 = *psVar1 - lVar4;
      local_88.
      super_arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>.
      writer_.out_.container =
           (this->context).
           super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
           .out_.container;
      local_88.
      super_arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>.
      writer_.locale_._M_t.
      super___uniq_ptr_impl<fmt::v5::locale_provider,_std::default_delete<fmt::v5::locale_provider>_>
      ._M_t.
      super__Tuple_impl<0UL,_fmt::v5::locale_provider_*,_std::default_delete<fmt::v5::locale_provider>_>
      .super__Head_base<0UL,_fmt::v5::locale_provider_*,_false>._M_head_impl =
           (__uniq_ptr_data<fmt::v5::locale_provider,_std::default_delete<fmt::v5::locale_provider>,_true,_true>
            )(__uniq_ptr_impl<fmt::v5::locale_provider,_std::default_delete<fmt::v5::locale_provider>_>
              )0x0;
      local_88.
      super_arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>.
      specs_ = &local_68;
      local_88.ctx_ = pbVar2;
      tVar6 = visit<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                        (&local_88,this->arg);
      (this->context).
      super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
      .out_.container = tVar6.container;
      if ((_Head_base<0UL,_fmt::v5::locale_provider_*,_false>)
          local_88.
          super_arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>
          .writer_.locale_._M_t.
          super___uniq_ptr_impl<fmt::v5::locale_provider,_std::default_delete<fmt::v5::locale_provider>_>
          ._M_t.
          super__Tuple_impl<0UL,_fmt::v5::locale_provider_*,_std::default_delete<fmt::v5::locale_provider>_>
          .super__Head_base<0UL,_fmt::v5::locale_provider_*,_false>._M_head_impl !=
          (_Head_base<0UL,_fmt::v5::locale_provider_*,_false>)0x0) {
        (*(*(_func_int ***)
            local_88.
            super_arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>
            .writer_.locale_._M_t.
            super___uniq_ptr_impl<fmt::v5::locale_provider,_std::default_delete<fmt::v5::locale_provider>_>
            ._M_t.
            super__Tuple_impl<0UL,_fmt::v5::locale_provider_*,_std::default_delete<fmt::v5::locale_provider>_>
            .super__Head_base<0UL,_fmt::v5::locale_provider_*,_false>._M_head_impl)[1])();
      }
    }
    iVar8.ptr_ = nVar7.ptr_;
    iVar8.end_ = nVar7.end_;
    return iVar8;
  }
LAB_0011f024:
  __assert_fail("(value >= 0) && \"negative value\"",
                "/workspace/llm4binary/github/license_all_cmakelists_25/fireice-uk[P]gulps/fmt/core.h"
                ,0xde,
                "typename std::make_unsigned<Int>::type fmt::internal::to_unsigned(Int) [Int = long]"
               );
}

Assistant:

fp(uint64_t f, int e): f(f), e(e) {}